

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O3

batch * __thiscall
ear::PolarExtentCoreSimd<xsimd::fma3<xsimd::avx2>_>::weight_stadium
          (batch *__return_storage_ptr__,PolarExtentCoreSimd<xsimd::fma3<xsimd::avx2>_> *this,
          PolarExtentCoreContext *ctx,
          PositionBatch<xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>_> *position)

{
  undefined4 uVar1;
  float fVar2;
  undefined4 uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  batch *pbVar18;
  PolarExtentCoreContext *ctx_00;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar30 [64];
  simd_register<float,_xsimd::fma3<xsimd::avx2>_> sin_angle;
  
  uVar1 = *(undefined4 *)((long)&this[8].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar19._4_4_ = uVar1;
  auVar19._0_4_ = uVar1;
  auVar19._8_4_ = uVar1;
  auVar19._12_4_ = uVar1;
  auVar19._16_4_ = uVar1;
  auVar19._20_4_ = uVar1;
  auVar19._24_4_ = uVar1;
  auVar19._28_4_ = uVar1;
  uVar1 = *(undefined4 *)&this[9].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  auVar23._16_4_ = uVar1;
  auVar23._20_4_ = uVar1;
  auVar23._24_4_ = uVar1;
  auVar23._28_4_ = uVar1;
  fVar2 = *(float *)((long)&this[9].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar21._0_8_ = ctx->num_points;
  auVar21._8_8_ = ctx->num_speakers;
  auVar21._16_8_ = ctx->real_num_speakers;
  auVar21._24_8_ = ctx->xs;
  auVar4._0_8_ = ctx->ys;
  auVar4._8_8_ = ctx->zs;
  auVar4._16_8_ = ctx->panning_results;
  auVar4._24_8_ = ctx->summed_panning_results;
  fVar11 = *(float *)&ctx->is_circular;
  fVar12 = ctx->flippedBasis[0];
  fVar13 = ctx->flippedBasis[1];
  fVar14 = ctx->flippedBasis[2];
  fVar15 = ctx->flippedBasis[3];
  fVar16 = ctx->flippedBasis[4];
  fVar17 = ctx->flippedBasis[5];
  auVar5._4_4_ = fVar12 * fVar2;
  auVar5._0_4_ = fVar11 * fVar2;
  auVar5._8_4_ = fVar13 * fVar2;
  auVar5._12_4_ = fVar14 * fVar2;
  auVar5._16_4_ = fVar15 * fVar2;
  auVar5._20_4_ = fVar16 * fVar2;
  auVar5._24_4_ = fVar17 * fVar2;
  auVar5._28_4_ = fVar2;
  auVar6 = vfmadd231ps_fma(auVar5,auVar4,auVar23);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar21,auVar19);
  uVar1 = *(undefined4 *)&this[10].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar20._4_4_ = uVar1;
  auVar20._0_4_ = uVar1;
  auVar20._8_4_ = uVar1;
  auVar20._12_4_ = uVar1;
  auVar20._16_4_ = uVar1;
  auVar20._20_4_ = uVar1;
  auVar20._24_4_ = uVar1;
  auVar20._28_4_ = uVar1;
  uVar3 = *(undefined4 *)((long)&this[10].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar24._4_4_ = uVar3;
  auVar24._0_4_ = uVar3;
  auVar24._8_4_ = uVar3;
  auVar24._12_4_ = uVar3;
  auVar24._16_4_ = uVar3;
  auVar24._20_4_ = uVar3;
  auVar24._24_4_ = uVar3;
  auVar24._28_4_ = uVar3;
  fVar2 = *(float *)&this[0xb].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar30._0_4_ = fVar11 * fVar2;
  auVar30._4_4_ = fVar12 * fVar2;
  auVar30._8_4_ = fVar13 * fVar2;
  auVar30._12_4_ = fVar14 * fVar2;
  auVar30._16_4_ = fVar15 * fVar2;
  auVar30._20_4_ = fVar16 * fVar2;
  auVar30._28_36_ = in_ZMM8._28_36_;
  auVar30._24_4_ = fVar17 * fVar2;
  auVar7 = vfmadd231ps_fma(auVar30._0_32_,auVar4,auVar24);
  uVar3 = *(undefined4 *)((long)&this[0xb].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar25._4_4_ = uVar3;
  auVar25._0_4_ = uVar3;
  auVar25._8_4_ = uVar3;
  auVar25._12_4_ = uVar3;
  auVar25._16_4_ = uVar3;
  auVar25._20_4_ = uVar3;
  auVar25._24_4_ = uVar3;
  auVar25._28_4_ = uVar3;
  uVar3 = *(undefined4 *)&this[0xc].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar29._4_4_ = uVar3;
  auVar29._0_4_ = uVar3;
  auVar29._8_4_ = uVar3;
  auVar29._12_4_ = uVar3;
  auVar29._16_4_ = uVar3;
  auVar29._20_4_ = uVar3;
  auVar29._24_4_ = uVar3;
  auVar29._28_4_ = uVar3;
  fVar2 = *(float *)((long)&this[0xc].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar21,auVar20);
  auVar22._4_4_ = fVar12 * fVar2;
  auVar22._0_4_ = fVar11 * fVar2;
  auVar22._8_4_ = fVar13 * fVar2;
  auVar22._12_4_ = fVar14 * fVar2;
  auVar22._16_4_ = fVar15 * fVar2;
  auVar22._20_4_ = fVar16 * fVar2;
  auVar22._24_4_ = fVar17 * fVar2;
  auVar22._28_4_ = uVar1;
  auVar8 = vfmadd231ps_fma(auVar22,auVar4,auVar29);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar21,auVar25);
  auVar26._8_4_ = 0x7fffffff;
  auVar26._0_8_ = 0x7fffffff7fffffff;
  auVar26._12_4_ = 0x7fffffff;
  auVar26._16_4_ = 0x7fffffff;
  auVar26._20_4_ = 0x7fffffff;
  auVar26._24_4_ = 0x7fffffff;
  auVar26._28_4_ = 0x7fffffff;
  uVar1 = *(undefined4 *)&this[0xd].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar28._4_4_ = uVar1;
  auVar28._0_4_ = uVar1;
  auVar28._8_4_ = uVar1;
  auVar28._12_4_ = uVar1;
  auVar28._16_4_ = uVar1;
  auVar28._20_4_ = uVar1;
  auVar28._24_4_ = uVar1;
  auVar28._28_4_ = uVar1;
  sin_angle.super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data =
       (simd_register<float,_xsimd::avx2>)vandps_avx(ZEXT1632(auVar6),auVar26);
  fVar2 = *(float *)((long)&this[0xd].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar9._4_4_ = auVar7._4_4_ * fVar2;
  auVar9._0_4_ = auVar7._0_4_ * fVar2;
  auVar9._8_4_ = auVar7._8_4_ * fVar2;
  auVar9._12_4_ = auVar7._12_4_ * fVar2;
  auVar9._16_4_ = fVar2 * 0.0;
  auVar9._20_4_ = fVar2 * 0.0;
  auVar9._24_4_ = fVar2 * 0.0;
  auVar9._28_4_ = fVar2;
  auVar6 = vfmadd231ps_fma(auVar9,(undefined1  [32])
                                  sin_angle.super_simd_register<float,_xsimd::avx2>.
                                  super_simd_register<float,_xsimd::avx>.data,auVar28);
  auVar4 = vcmpps_avx(ZEXT432(0) << 0x20,ZEXT1632(auVar6),2);
  auVar21 = vandps_avx(ZEXT1632(auVar8),auVar26);
  weight_from_sin(__return_storage_ptr__,this,ctx,
                  (batch)sin_angle.super_simd_register<float,_xsimd::avx2>.
                         super_simd_register<float,_xsimd::avx>.data);
  uVar1 = *(undefined4 *)&this[0xe].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar27._4_4_ = uVar1;
  auVar27._0_4_ = uVar1;
  auVar27._8_4_ = uVar1;
  auVar27._12_4_ = uVar1;
  auVar27._16_4_ = uVar1;
  auVar27._20_4_ = uVar1;
  auVar27._24_4_ = uVar1;
  auVar27._28_4_ = uVar1;
  fVar2 = *(float *)((long)&this[0xe].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar10._4_4_ = fVar2 * auVar7._4_4_;
  auVar10._0_4_ = fVar2 * auVar7._0_4_;
  auVar10._8_4_ = fVar2 * auVar7._8_4_;
  auVar10._12_4_ = fVar2 * auVar7._12_4_;
  auVar10._16_4_ = fVar2 * 0.0;
  auVar10._20_4_ = fVar2 * 0.0;
  auVar10._24_4_ = fVar2 * 0.0;
  auVar10._28_4_ = fVar2;
  auVar6 = vfmadd231ps_fma(auVar10,auVar27,
                           (undefined1  [32])
                           sin_angle.super_simd_register<float,_xsimd::avx2>.
                           super_simd_register<float,_xsimd::avx>.data);
  auVar22 = ZEXT1632(auVar6);
  pbVar18 = weight_from_cos(__return_storage_ptr__,this,ctx_00,
                            (batch)sin_angle.super_simd_register<float,_xsimd::avx2>.
                                   super_simd_register<float,_xsimd::avx>.data);
  auVar5 = vpcmpeqd_avx2(auVar27,auVar27);
  auVar5 = auVar5 & ~auVar4;
  if (((((((((auVar5 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
            (auVar5 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           (auVar5 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          SUB321(auVar5 >> 0x7f,0) != '\0') ||
         (auVar5 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        SUB321(auVar5 >> 0xbf,0) != '\0') ||
       (auVar5 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar5[0x1f] < '\0') &&
     ((((((((auVar4 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar4 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar4 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar4 >> 0x7f,0) != '\0') ||
        (auVar4 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar4 >> 0xbf,0) != '\0') ||
      (auVar4 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar4[0x1f] < '\0')) {
    vblendvps_avx(auVar22,auVar21,auVar4);
  }
  return pbVar18;
}

Assistant:

batch weight_stadium(PolarExtentCoreContext &ctx,
                         const PositionBatch<batch> &position) const {
      PositionBatch<batch> position_t = position.transform(ctx.flippedBasis);

      PositionBatch<batch> position_t_right = position_t;
      position_t_right.x = xsimd::abs(position_t.x);

      auto circle_test_dot =
          xsimd::fma(position_t_right.x, batch{ctx.circle_test[0]},
                     position_t_right.y * batch{ctx.circle_test[1]});
      auto in_straight_line_part = circle_test_dot >= batch{0.0};

      // for the straight line part
      auto straight_val = weight_from_sin(ctx, xsimd::abs(position_t.z));

      // for the circle part
      auto circle_dot =
          xsimd::fma(position_t_right.x, batch{ctx.right_circle_centre[0]},
                     position_t_right.y * batch{ctx.right_circle_centre[1]});
      auto circle_val = weight_from_cos(ctx, circle_dot);

      if (xsimd::all(in_straight_line_part))
        return straight_val;
      else if (xsimd::none(in_straight_line_part))
        return circle_val;
      else
        return xsimd::select(in_straight_line_part, straight_val, circle_val);
    }